

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.h
# Opt level: O2

ImageList * __thiscall aeron::Subscription::removeAndCloseAllImages(Subscription *this)

{
  ImageList *pIVar1;
  __pointer_type pIVar2;
  undefined8 *puVar3;
  int in_ESI;
  size_t sVar4;
  Image *this_00;
  bool bVar5;
  
  pIVar1 = (this->m_imageList)._M_b._M_p;
  this_00 = pIVar1->m_images;
  sVar4 = pIVar1->m_length;
  while (bVar5 = sVar4 != 0, sVar4 = sVar4 - 1, bVar5) {
    Image::close(this_00,in_ESI);
    this_00 = this_00 + 1;
  }
  pIVar2 = (__pointer_type)operator_new(0x10);
  puVar3 = (undefined8 *)operator_new__(8);
  *puVar3 = 0;
  pIVar2->m_images = (Image *)(puVar3 + 1);
  pIVar2->m_length = 0;
  (this->m_imageList)._M_b._M_p = pIVar2;
  (this->m_isClosed)._M_base._M_i = true;
  return pIVar1;
}

Assistant:

struct ImageList *removeAndCloseAllImages()
    {
        struct ImageList *oldImageList = std::atomic_load_explicit(&m_imageList, std::memory_order_acquire);
        Image *oldArray = oldImageList->m_images;
        std::size_t length = oldImageList->m_length;

        for (std::size_t i = 0; i < length; i++)
        {
            oldArray[i].close();
        }

        auto newImageList = new struct ImageList(new Image[0], 0);

        std::atomic_store_explicit(&m_imageList, newImageList, std::memory_order_release);
        std::atomic_store_explicit(&m_isClosed, true, std::memory_order_release);

        return oldImageList;
    }